

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O2

int __thiscall PyCode::generateMainPy(PyCode *this,string *cwd)

{
  char cVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string path;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs);
  std::operator+(&path,cwd,"/main.py");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&ofs,"from prettytable import PrettyTable\n");
    std::operator<<((ostream *)&ofs,"from MFStruct import operateClass\n");
    std::operator<<((ostream *)&ofs,"from postgresCon import postgresCon\n");
    std::operator<<((ostream *)&ofs,"\n");
    std::operator<<((ostream *)&ofs,"def main():\n");
    std::operator+(&local_270,"\tselectAttr = \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::operator+(&local_250,&local_270,"\"\n");
    std::operator<<((ostream *)&ofs,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::operator+(&local_270,"\thavingCond = \"",&(this->mfStruct).havingCond);
    std::operator+(&local_250,&local_270,"\"\n");
    std::operator<<((ostream *)&ofs,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::operator+(&local_270,"\tgroup_attr = \",\".join([\"",&(this->mfStruct).groupAttr);
    std::operator+(&local_250,&local_270,"\"])\n");
    std::operator<<((ostream *)&ofs,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::operator+(&local_270,"\tagg_func = dict(",&(this->mfStruct).aggFunc);
    std::operator+(&local_250,&local_270,")\n");
    std::operator<<((ostream *)&ofs,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::operator+(&local_270,"\tselect_cond = dict(",&(this->mfStruct).selectCondVect);
    std::operator+(&local_250,&local_270,")\n");
    std::operator<<((ostream *)&ofs,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::operator<<((ostream *)&ofs,"\tfor key in agg_func:\n");
    std::operator<<((ostream *)&ofs,"\t\tagg_func[key] = agg_func[key].split(\", \")\n");
    std::operator<<((ostream *)&ofs,"\tsize = 3\n");
    std::operator<<((ostream *)&ofs,
                    "\tmf_struct = operateClass(selectAttr, havingCond, size, group_attr, agg_func, select_cond)\n"
                   );
    std::operator<<((ostream *)&ofs,"\tmf_struct.parse_agg_group()\n");
    std::operator<<((ostream *)&ofs,"\tmf_struct.parse_select_attr()\n");
    std::operator<<((ostream *)&ofs,"\n");
    std::operator<<((ostream *)&ofs,"\tusrname = input(\"Input username for connecting DB: \")\n");
    std::operator<<((ostream *)&ofs,"\tpwd = input(\"Input pwd for connecting DB\")\n");
    std::operator<<((ostream *)&ofs,"\thost = input(\"Input DB address: \")\n");
    std::operator<<((ostream *)&ofs,"\tconn = postgresCon(usrname, pwd, host, mf_struct)\n");
    std::operator<<((ostream *)&ofs,"\tconn.get_group_attr_data()\n");
    std::operator<<((ostream *)&ofs,"\tconn.main_algo()\n");
    std::operator<<((ostream *)&ofs,"\tconn.closeDB()\n");
    std::operator<<((ostream *)&ofs,"\toutput = conn.project_data()\n");
    std::operator<<((ostream *)&ofs,"\tprint(output)\n");
    std::operator<<((ostream *)&ofs,"\n\n");
    std::operator<<((ostream *)&ofs,"if __name__ == \"__main__\":\n");
    std::operator<<((ostream *)&ofs,"\tmain()\n");
    std::__cxx11::string::~string((string *)&path);
    std::ofstream::~ofstream(&ofs);
    return 0;
  }
  std::ios::clear((int)(string *)&ofs + (int)*(undefined8 *)(_ofs + -0x18));
  std::ofstream::close();
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00115d88;
  __cxa_throw(puVar2,&ParserClassException::FileNotOpenException::typeinfo,
              std::exception::~exception);
}

Assistant:

int PyCode::generateMainPy(std::string cwd) throw()
{
    std::ofstream ofs;
    std::string path = cwd + "/main.py";
    ofs.open(path, std::ios::out);
    if (!ofs.is_open())
    {
        ofs.clear();
        ofs.close();
        throw ParserClassException::FileNotOpenException();
    }
    else
    {
        ofs << "from prettytable import PrettyTable\n";
        ofs << "from MFStruct import operateClass\n";
        ofs << "from postgresCon import postgresCon\n";
        ofs << "\n";
        ofs << "def main():\n";
        ofs << "\tselectAttr = \"" + this->mfStruct.selectAttr + "\"\n";
        ofs << "\thavingCond = \"" + this->mfStruct.havingCond + "\"\n";
        ofs << "\tgroup_attr = \",\".join([\"" + this->mfStruct.groupAttr + "\"])\n";
        ofs << "\tagg_func = dict(" + this->mfStruct.aggFunc + ")\n";
        ofs << "\tselect_cond = dict(" + this->mfStruct.selectCondVect + ")\n";
        ofs << "\tfor key in agg_func:\n";
        ofs << "\t\tagg_func[key] = agg_func[key].split(\", \")\n";
        ofs << "\tsize = 3\n";
        ofs << "\tmf_struct = operateClass(selectAttr, havingCond, size, group_attr, agg_func, select_cond)\n";
        ofs << "\tmf_struct.parse_agg_group()\n";
        ofs << "\tmf_struct.parse_select_attr()\n";
        ofs << "\n";
        ofs << "\tusrname = input(\"Input username for connecting DB: \")\n";
        ofs << "\tpwd = input(\"Input pwd for connecting DB\")\n";
        ofs << "\thost = input(\"Input DB address: \")\n";
        ofs << "\tconn = postgresCon(usrname, pwd, host, mf_struct)\n";
        ofs << "\tconn.get_group_attr_data()\n";
        ofs << "\tconn.main_algo()\n";
        ofs << "\tconn.closeDB()\n";
        ofs << "\toutput = conn.project_data()\n";
        ofs << "\tprint(output)\n";
        ofs << "\n\n";
        ofs << "if __name__ == \"__main__\":\n";
        ofs << "\tmain()\n";
    }
    return 0;
}